

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WirehairCodec.cpp
# Opt level: O3

void __thiscall wirehair::Codec::SetHeavyRows(Codec *this)

{
  uint8_t *puVar1;
  undefined1 *puVar2;
  long lVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  
  uVar6 = this->_heavy_pitch;
  uVar5 = (ulong)this->_heavy_columns;
  puVar2 = &kHeavyMatrix;
  lVar3 = 0;
  puVar1 = this->_heavy_matrix + this->_extra_count * uVar6;
  do {
    iVar4 = (int)uVar5;
    uVar5 = 0;
    if (iVar4 != 0) {
      uVar7 = 0;
      do {
        puVar1[uVar7] = puVar2[uVar7];
        uVar7 = uVar7 + 1;
        uVar5 = (ulong)this->_heavy_columns;
      } while (uVar7 < uVar5);
      uVar6 = this->_heavy_pitch;
    }
    lVar3 = lVar3 + 1;
    puVar1 = puVar1 + uVar6;
    puVar2 = puVar2 + 0x12;
  } while (lVar3 != 6);
  return;
}

Assistant:

void Codec::SetHeavyRows()
{
    CAT_IF_DUMP(cout << endl << "---- SetHeavyRows ----" << endl << endl;)

    // Skip extra rows
    uint8_t * GF256_RESTRICT heavy_offset = _heavy_matrix + _heavy_pitch * _extra_count;

    uint8_t * GF256_RESTRICT heavy_row = heavy_offset;

    // For each heavy matrix word:
    for (unsigned row_i = 0; row_i < kHeavyRows; ++row_i, heavy_row += _heavy_pitch)
    {
        // NOTE: Each heavy row is a multiple of 4 bytes in size
        for (unsigned col_i = 0; col_i < _heavy_columns; col_i++) {
            heavy_row[col_i] = kHeavyMatrix[row_i][col_i];
        }
    }

#ifdef CAT_IDENTITY_LOWER_RIGHT
    uint8_t * GF256_RESTRICT lower_right = heavy_offset + _heavy_columns - kHeavyRows;

    // Add identity matrix to tie heavy rows to heavy mixing columns
    for (unsigned ii = 0; ii < kHeavyRows; ++ii, lower_right += _heavy_pitch)
    {
        for (unsigned jj = 0; jj < kHeavyRows; ++jj) {
            lower_right[jj] = (ii == jj) ? 1 : 0;
        }
    }
#endif
}